

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallFileGenerator::GenerateCxxModuleConfigInformation
          (cmExportInstallFileGenerator *this,string *name,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  string *name_local;
  cmExportInstallFileGenerator *this_local;
  
  poVar1 = std::operator<<(os,
                           "# Load information for each installed configuration.\nfile(GLOB _cmake_cxx_module_includes \"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-"
                          );
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,
                  "-*.cmake\")\nforeach(_cmake_cxx_module_include IN LISTS _cmake_cxx_module_includes)\n  include(\"${_cmake_cxx_module_include}\")\nendforeach()\nunset(_cmake_cxx_module_include)\nunset(_cmake_cxx_module_includes)\n"
                 );
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateCxxModuleConfigInformation(
  std::string const& name, std::ostream& os) const
{
  // Now load per-configuration properties for them.
  /* clang-format off */
  os << "# Load information for each installed configuration.\n"
        "file(GLOB _cmake_cxx_module_includes \"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-" << name << "-*.cmake\")\n"
        "foreach(_cmake_cxx_module_include IN LISTS _cmake_cxx_module_includes)\n"
        "  include(\"${_cmake_cxx_module_include}\")\n"
        "endforeach()\n"
        "unset(_cmake_cxx_module_include)\n"
        "unset(_cmake_cxx_module_includes)\n";
  /* clang-format on */
}